

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::setWindowTitle_sys(QWidgetPrivate *this,QString *caption)

{
  QWidget *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  QWindow *pQVar6;
  long *plVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) goto LAB_002fa1c7;
  pQVar6 = QWidget::windowHandle(this_00);
  if (pQVar6 == (QWindow *)0x0) goto LAB_002fa1c7;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  cVar4 = QAccessible::isActive();
  if (cVar4 == '\0') {
LAB_002fa1b4:
    QWindow::setTitle((QString *)pQVar6);
  }
  else {
    plVar7 = (long *)QAccessible::queryAccessibleInterface(&this_00->super_QObject);
    if (plVar7 == (long *)0x0) goto LAB_002fa1b4;
    (**(code **)(*plVar7 + 0x60))(&local_58,plVar7,0);
    qVar3 = local_78.size;
    pcVar2 = local_78.ptr;
    pDVar1 = local_78.d;
    local_78.d = local_58.d;
    local_78.ptr = local_58.ptr;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_78.size = local_58.size;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QWindow::setTitle((QString *)pQVar6);
    (**(code **)(*plVar7 + 0x60))(&local_58,plVar7,0);
    bVar5 = ::operator!=((QString *)&local_58,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (bVar5) {
      local_58.d = (Data *)QFont::strikeOut;
      local_58.ptr = (char16_t *)0xaaaaaaaa0000800c;
      local_40 = 0xaaaaaaaaffffffff;
      local_58.size = (qsizetype)this_00;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_002fa1c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWindowTitle_sys(const QString &caption)
{
    Q_Q(QWidget);
    if (!q->isWindow())
        return;

    if (QWindow *window = q->windowHandle())
    {
#if QT_CONFIG(accessibility)
        QString oldAccessibleName;
        const QAccessibleInterface *accessible = QAccessible::isActive()
                                               ? QAccessible::queryAccessibleInterface(q)
                                               : nullptr;
        if (accessible)
            oldAccessibleName = accessible->text(QAccessible::Name);
#endif

        window->setTitle(caption);

#if QT_CONFIG(accessibility)
        if (accessible && accessible->text(QAccessible::Name) != oldAccessibleName) {
            QAccessibleEvent event(q, QAccessible::NameChanged);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}